

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O1

void Rml::ElementUtilities::GetElementsByTagName
               (ElementList *elements,Element *root_element,String *tag)

{
  pointer *pppEVar1;
  size_t __n;
  iterator __position;
  int iVar2;
  String *pSVar3;
  int i_1;
  int i;
  int iVar4;
  Element *element;
  SearchQueue search_queue;
  Element *local_98;
  Element *local_90;
  _Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  iVar4 = 0;
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::_M_initialize_map
            (&local_88,0);
  while( true ) {
    iVar2 = Element::GetNumChildren(root_element,false);
    if (iVar2 <= iVar4) break;
    local_98 = Element::GetChild(root_element,iVar4);
    ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
              ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_88,&local_98);
    iVar4 = iVar4 + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_98 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pSVar3 = Element::GetTagName_abi_cxx11_(local_98);
      __n = pSVar3->_M_string_length;
      if (__n == tag->_M_string_length) {
        if (__n != 0) {
          iVar4 = bcmp((pSVar3->_M_dataplus)._M_p,(tag->_M_dataplus)._M_p,__n);
          if (iVar4 != 0) goto LAB_00234789;
        }
        __position._M_current =
             (elements->super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (elements->super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
          _M_realloc_insert<Rml::Element*const&>
                    ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)elements,__position,
                     &local_98);
        }
        else {
          *__position._M_current = local_98;
          pppEVar1 = &(elements->super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
      }
LAB_00234789:
      iVar4 = 0;
      while( true ) {
        iVar2 = Element::GetNumChildren(local_98,false);
        if (iVar2 <= iVar4) break;
        local_90 = Element::GetChild(local_98,iVar4);
        ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
                  ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_88,&local_90);
        iVar4 = iVar4 + 1;
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void ElementUtilities::GetElementsByTagName(ElementList& elements, Element* root_element, const String& tag)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	for (int i = 0; i < root_element->GetNumChildren(); ++i)
		search_queue.push(root_element->GetChild(i));

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetTagName() == tag)
			elements.push_back(element);

		// Add all children to search.
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}
}